

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bool __thiscall
fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned__int128,char>
          (detail *this,appender *out,unsigned___int128 value,uint prefix,
          basic_format_specs<char> *specs,locale_ref loc)

{
  undefined1 value_00 [16];
  appender aVar1;
  locale_ref in_R9;
  digit_grouping<char> *this_00;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 local_70 [8];
  digit_grouping<char> grouping;
  basic_format_specs<char> *specs_local;
  uint prefix_local;
  unsigned___int128 value_local;
  appender *out_local;
  locale_ref loc_local;
  
  this_00 = (digit_grouping<char> *)local_70;
  grouping.sep_._32_8_ = loc.locale_;
  digit_grouping<char>::digit_grouping(this_00,in_R9,true);
  value_00._8_8_ = in_stack_ffffffffffffff50;
  value_00._0_8_ = this_00;
  aVar1 = write_int_localized<fmt::v8::appender,unsigned__int128,char>
                    (*(detail **)this,(appender)out,(unsigned___int128)value_00,prefix,
                     (basic_format_specs<char> *)((ulong)specs & 0xffffffff),
                     (digit_grouping<char> *)grouping.sep_._32_8_);
  *(back_insert_iterator<fmt::v8::detail::buffer<char>_> *)this =
       aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  digit_grouping<char>::~digit_grouping((digit_grouping<char> *)local_70);
  return true;
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  auto grouping = digit_grouping<Char>(loc);
  out = write_int_localized(out, value, prefix, specs, grouping);
  return true;
}